

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O0

void __thiscall
flow::lang::LiteralExpr<flow::util::IPAddress>::LiteralExpr
          (LiteralExpr<flow::util::IPAddress> *this)

{
  SourceLocation local_90;
  IPAddress local_54;
  LiteralExpr<flow::util::IPAddress> *local_10;
  LiteralExpr<flow::util::IPAddress> *this_local;
  
  local_10 = this;
  util::IPAddress::IPAddress(&local_54);
  SourceLocation::SourceLocation(&local_90);
  LiteralExpr(this,&local_54,&local_90);
  SourceLocation::~SourceLocation(&local_90);
  return;
}

Assistant:

LiteralExpr() : LiteralExpr(T(), SourceLocation()) {}